

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O3

void __thiscall MppMetaService::MppMetaService(MppMetaService *this)

{
  MppTrie *trie;
  long lVar1;
  
  this->meta_id = 0;
  this->meta_count = 0;
  this->finished = 0;
  mpp_spinlock_init(&this->mLock);
  (this->mlist_meta).next = &this->mlist_meta;
  (this->mlist_meta).prev = &this->mlist_meta;
  trie = &this->mTrie;
  mpp_trie_init(trie,"MppMetaDef");
  lVar1 = 0;
  do {
    mpp_trie_add_info(*trie,(char *)((long)meta_defs + lVar1),(void *)0x0,0);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x168);
  mpp_trie_add_info(*trie,(char *)0x0,(void *)0x0,0);
  return;
}

Assistant:

MppMetaService::MppMetaService()
    : meta_id(0),
      meta_count(0),
      finished(0)
{
    RK_U32 i;

    mpp_spinlock_init(&mLock);
    INIT_LIST_HEAD(&mlist_meta);

    mpp_trie_init(&mTrie, "MppMetaDef");
    for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++) {
        mpp_trie_add_info(mTrie, (const char *)&meta_defs[i], NULL, 0);
    }
    mpp_trie_add_info(mTrie, NULL, NULL, 0);
}